

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * utxoupdatepsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffef58;
  allocator<RPCArg> *paVar1;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffef60;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffef68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef70;
  string *in_stack_ffffffffffffef88;
  string *in_stack_ffffffffffffef90;
  UniValue *in_stack_ffffffffffffef98;
  iterator in_stack_ffffffffffffefa0;
  RPCArgOptions *in_stack_ffffffffffffefa8;
  string *in_stack_ffffffffffffefb0;
  undefined7 in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefbf;
  undefined4 in_stack_ffffffffffffefc0;
  Type in_stack_ffffffffffffefc4;
  string *in_stack_ffffffffffffefc8;
  undefined4 in_stack_ffffffffffffefd0;
  Type in_stack_ffffffffffffefd4;
  undefined4 in_stack_ffffffffffffefd8;
  Type in_stack_ffffffffffffefdc;
  RPCArg *in_stack_ffffffffffffefe0;
  undefined1 *local_1008;
  RPCArgOptions *opts;
  undefined1 *local_ff0;
  undefined1 *local_fd8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_e5a;
  allocator<char> local_e59;
  pointer local_e58;
  pointer pRStack_e50;
  pointer local_e48;
  undefined8 in_stack_fffffffffffff1c0;
  allocator<char> local_e19 [7];
  allocator<char> local_e12;
  allocator<char> local_e11 [8];
  allocator<char> local_e09 [32];
  undefined1 local_de9 [7];
  undefined1 local_de2;
  undefined1 local_de1 [8];
  string local_dd9;
  undefined1 local_db9 [8];
  allocator<char> local_db1;
  undefined4 local_db0;
  allocator<char> local_da9 [31];
  allocator<char> local_d8a;
  allocator<char> local_d89 [329];
  allocator<RPCArg> local_c40 [40];
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined1 local_c00;
  undefined1 local_bff;
  allocator<RPCArg> local_bf8 [40];
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined1 local_bb8;
  undefined1 local_bb7;
  undefined1 local_bb0;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined1 local_b70;
  undefined1 local_b6f;
  undefined1 local_a70;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined1 local_a30;
  undefined1 local_a2f;
  undefined1 local_988 [528];
  undefined1 local_778 [160];
  undefined1 local_6d8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined1 local_697;
  undefined1 local_5f0 [264];
  RPCResults local_4e8 [11];
  undefined1 local_3e0 [160];
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  opts = (RPCArgOptions *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_db0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,&in_stack_ffffffffffffef60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef58);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                 in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
                 in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_db9._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,&in_stack_ffffffffffffef60->typ);
  this_00 = (RPCHelpMan *)local_db9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  name = (string *)(local_de1 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_de1._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,&in_stack_ffffffffffffef60->typ);
  description = (string *)local_de1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_6d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_6b0 = 0;
  uStack_6a8 = 0;
  local_6a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef58);
  local_698 = 0;
  local_697 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                 in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
                 in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  results = local_4e8;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_de2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_de9._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,&in_stack_ffffffffffffef60->typ);
  examples = (RPCExamples *)local_de9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_e11[1] = (allocator<char>)0x0;
  local_e11[2] = (allocator<char>)0x0;
  local_e11[3] = (allocator<char>)0x0;
  local_e11[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,&in_stack_ffffffffffffef60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_a70 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_a48 = 0;
  uStack_a40 = 0;
  local_a38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef58);
  local_a30 = 0;
  local_a2f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                 in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
                 in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_e19[1] = (allocator<char>)0xe8;
  local_e19[2] = (allocator<char>)0x3;
  local_e19[3] = (allocator<char>)0x0;
  local_e19[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_bb0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_b88 = 0;
  uStack_b80 = 0;
  local_b78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef58);
  local_b70 = 0;
  local_b6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                 in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
                 in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffef58);
  __l._M_len = (size_type)in_stack_ffffffffffffefa8;
  __l._M_array = in_stack_ffffffffffffefa0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef98,__l,
             (allocator_type *)in_stack_ffffffffffffef90);
  local_bf8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_bd0 = 0;
  uStack_bc8 = 0;
  local_bc0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef58);
  local_bb8 = 0;
  local_bb7 = 0;
  paVar1 = local_bf8;
  RPCArg::RPCArg(in_stack_ffffffffffffefe0,
                 (string *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                 in_stack_ffffffffffffefd4,(Fallback *)in_stack_ffffffffffffefc8,
                 (string *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),opts);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len = (size_type)in_stack_ffffffffffffefa8;
  __l_00._M_array = in_stack_ffffffffffffefa0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef98,__l_00,
             (allocator_type *)in_stack_ffffffffffffef90);
  local_c40[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffef70);
  local_c18 = 0;
  uStack_c10 = 0;
  local_c08 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_c00 = 0;
  local_bff = 0;
  paVar1 = local_c40;
  RPCArg::RPCArg(in_stack_ffffffffffffefe0,
                 (string *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                 in_stack_ffffffffffffefd4,(Fallback *)in_stack_ffffffffffffefc8,
                 (string *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),opts);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len = (size_type)in_stack_ffffffffffffefa8;
  __l_01._M_array = in_stack_ffffffffffffefa0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef98,__l_01,
             (allocator_type *)in_stack_ffffffffffffef90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  local_e58 = (pointer)0x0;
  pRStack_e50 = (pointer)0x0;
  local_e48 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc,
             (string *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
             (bool)in_stack_ffffffffffffefbf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (allocator<char> *)in_stack_ffffffffffffef98);
  HelpExampleCli(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0x13aea60);
  this = (RPCArg *)&stack0xfffffffffffff180;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<utxoupdatepsbt()::__0,void>
            (in_stack_ffffffffffffef68,(anon_class_1_0_00000001 *)in_stack_ffffffffffffef60);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff1c0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e59);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef68);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff1c6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff1c7);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_fd8 = local_48;
  do {
    local_fd8 = local_fd8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_fd8 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_ff0 = local_3e0;
  do {
    local_ff0 = local_ff0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_ff0 != local_5f0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1008 = local_778;
  do {
    local_1008 = local_1008 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1008 != local_988);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_e19);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e12);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_e11);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_e09);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_de9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_de2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_de1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_de1 + 8));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_db9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_db9 + 7));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_db1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_da9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d89);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan utxoupdatepsbt()
{
    return RPCHelpMan{"utxoupdatepsbt",
            "\nUpdates all segwit inputs and outputs in a PSBT with data from output descriptors, the UTXO set, txindex, or the mempool.\n",
            {
                {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"},
                {"descriptors", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "An array of either strings or objects", {
                    {"", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "An output descriptor"},
                    {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "An object with an output descriptor and extra information", {
                         {"desc", RPCArg::Type::STR, RPCArg::Optional::NO, "An output descriptor"},
                         {"range", RPCArg::Type::RANGE, RPCArg::Default{1000}, "Up to what index HD chains should be explored (either end or [begin,end])"},
                    }},
                }},
            },
            RPCResult {
                    RPCResult::Type::STR, "", "The base64-encoded partially signed transaction with inputs updated"
            },
            RPCExamples {
                HelpExampleCli("utxoupdatepsbt", "\"psbt\"")
            },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Parse descriptors, if any.
    FlatSigningProvider provider;
    if (!request.params[1].isNull()) {
        auto descs = request.params[1].get_array();
        for (size_t i = 0; i < descs.size(); ++i) {
            EvalDescriptorStringOrObject(descs[i], provider);
        }
    }

    // We don't actually need private keys further on; hide them as a precaution.
    const PartiallySignedTransaction& psbtx = ProcessPSBT(
        request.params[0].get_str(),
        request.context,
        HidingSigningProvider(&provider, /*hide_secret=*/true, /*hide_origin=*/false),
        /*sighash_type=*/SIGHASH_ALL,
        /*finalize=*/false);

    DataStream ssTx{};
    ssTx << psbtx;
    return EncodeBase64(ssTx);
},
    };
}